

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O0

void txvalidationcache_tests::tx_mempool_block_doublespend_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  tx_mempool_block_doublespend t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff158;
  std_string *in_stack_fffffffffffff160;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff168;
  const_string *in_stack_fffffffffffff180;
  size_t in_stack_fffffffffffff188;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff190;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff198;
  undefined1 local_cb0 [184];
  tx_mempool_block_doublespend *in_stack_fffffffffffff408;
  undefined1 local_b18 [408];
  undefined1 local_980 [408];
  undefined1 local_7e8 [1608];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [29])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  tx_mempool_block_doublespend::tx_mempool_block_doublespend
            ((tx_mempool_block_doublespend *)in_stack_fffffffffffff158);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_7e8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [29])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [16])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::setup_conditional<txvalidationcache_tests::tx_mempool_block_doublespend>
            ((tx_mempool_block_doublespend *)0xbd57ce);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_980,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [29])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  tx_mempool_block_doublespend::test_method(in_stack_fffffffffffff408);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_b18,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [29])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [19])in_stack_fffffffffffff160);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::teardown_conditional<txvalidationcache_tests::tx_mempool_block_doublespend>
            ((tx_mempool_block_doublespend *)0xbd5a18);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  __s = local_cb0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  msg = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [29])in_stack_fffffffffffff160);
  this_00 = boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  tx_mempool_block_doublespend::~tx_mempool_block_doublespend
            ((tx_mempool_block_doublespend *)in_stack_fffffffffffff158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(tx_mempool_block_doublespend, Dersig100Setup)
{
    // Make sure skipping validation of transactions that were
    // validated going into the memory pool does not allow
    // double-spends in blocks to pass validation when they should not.

    CScript scriptPubKey = CScript() <<  ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;

    const auto ToMemPool = [this](const CMutableTransaction& tx) {
        LOCK(cs_main);

        const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(tx));
        return result.m_result_type == MempoolAcceptResult::ResultType::VALID;
    };

    // Create a double-spend of mature coinbase txn:
    std::vector<CMutableTransaction> spends;
    spends.resize(2);
    for (int i = 0; i < 2; i++)
    {
        spends[i].version = 1;
        spends[i].vin.resize(1);
        spends[i].vin[0].prevout.hash = m_coinbase_txns[0]->GetHash();
        spends[i].vin[0].prevout.n = 0;
        spends[i].vout.resize(1);
        spends[i].vout[0].nValue = 11*CENT;
        spends[i].vout[0].scriptPubKey = scriptPubKey;

        // Sign:
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(scriptPubKey, spends[i], 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        spends[i].vin[0].scriptSig << vchSig;
    }

    CBlock block;

    // Test 1: block with both of those transactions should be rejected.
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }

    // Test 2: ... and should be rejected if spend1 is in the memory pool
    BOOST_CHECK(ToMemPool(spends[0]));
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 1U);
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->removeRecursive(CTransaction{spends[0]}, MemPoolRemovalReason::CONFLICT));
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);

    // Test 3: ... and should be rejected if spend2 is in the memory pool
    BOOST_CHECK(ToMemPool(spends[1]));
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 1U);
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->removeRecursive(CTransaction{spends[1]}, MemPoolRemovalReason::CONFLICT));
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);

    // Final sanity test: first spend in *m_node.mempool, second in block, that's OK:
    std::vector<CMutableTransaction> oneSpend;
    oneSpend.push_back(spends[0]);
    BOOST_CHECK(ToMemPool(spends[1]));
    block = CreateAndProcessBlock(oneSpend, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash());
    }
    // spends[1] should have been removed from the mempool when the
    // block with spends[0] is accepted:
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);
}